

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O3

void retry_control_reset(RETRY_CONTROL_HANDLE retry_control_handle)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (retry_control_handle == (RETRY_CONTROL_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                 ,"retry_control_reset",0x112,1,
                 "Failed to reset the retry control (retry_state_handle is NULL)");
      return;
    }
  }
  else {
    retry_control_handle->retry_count = 0;
    retry_control_handle->current_wait_time_in_secs = 0;
    *(undefined4 *)&retry_control_handle->first_retry_tick_seconds = 0xffffffff;
    *(undefined4 *)((long)&retry_control_handle->first_retry_tick_seconds + 4) = 0xffffffff;
    *(undefined4 *)&retry_control_handle->last_retry_tick_seconds = 0xffffffff;
    *(undefined4 *)((long)&retry_control_handle->last_retry_tick_seconds + 4) = 0xffffffff;
  }
  return;
}

Assistant:

void retry_control_reset(RETRY_CONTROL_HANDLE retry_control_handle)
{
    if (retry_control_handle == NULL)
    {
        LogError("Failed to reset the retry control (retry_state_handle is NULL)");
    }
    else
    {
        RETRY_CONTROL_INSTANCE* retry_control = (RETRY_CONTROL_INSTANCE*)retry_control_handle;

        retry_control->retry_count = 0;
        retry_control->current_wait_time_in_secs = 0;
        retry_control->first_retry_tick_seconds = INDEFINITE_TIME;
        retry_control->last_retry_tick_seconds = INDEFINITE_TIME;
    }
}